

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_write_native(mpack_writer_t *writer,char *p,size_t count)

{
  if ((ulong)((long)writer->end - (long)writer->current) < count) {
    mpack_write_native_straddle(writer,p,count);
    return;
  }
  memcpy(writer->current,p,count);
  writer->current = writer->current + count;
  return;
}

Assistant:

MPACK_STATIC_INLINE void mpack_write_native(mpack_writer_t* writer, const char* p, size_t count) {
    mpack_assert(count == 0 || p != NULL, "data pointer for %i bytes is NULL", (int)count);

    if (mpack_writer_buffer_left(writer) < count) {
        mpack_write_native_straddle(writer, p, count);
    } else {
        mpack_memcpy(writer->current, p, count);
        writer->current += count;
    }
}